

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<const_testing::MatcherInterface<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>_>
* __thiscall
testing::internal::
linked_ptr<const_testing::MatcherInterface<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>_>
::operator=(linked_ptr<const_testing::MatcherInterface<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>_>
            *this,linked_ptr<const_testing::MatcherInterface<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>_>
                  *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::MatcherInterface<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>const>
    ::
    copy<testing::MatcherInterface<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>const>
              ((linked_ptr<testing::MatcherInterface<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>const>
                *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }